

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.c
# Opt level: O0

int do_setrlimit(int nargs,char **args)

{
  __rlimit_resource_t __resource;
  int iVar1;
  long in_RSI;
  int resource;
  rlimit limit;
  rlimit local_20;
  long local_10;
  
  local_10 = in_RSI;
  __resource = atoi(*(char **)(in_RSI + 8));
  iVar1 = atoi(*(char **)(local_10 + 0x10));
  local_20.rlim_cur = (rlim_t)iVar1;
  iVar1 = atoi(*(char **)(local_10 + 0x18));
  local_20.rlim_max = (rlim_t)iVar1;
  iVar1 = setrlimit(__resource,&local_20);
  return iVar1;
}

Assistant:

int do_setrlimit(int nargs, char **args)
{
    struct rlimit limit;
    int resource;
    resource = atoi(args[1]);
    limit.rlim_cur = atoi(args[2]);
    limit.rlim_max = atoi(args[3]);
    return setrlimit(resource, &limit);
}